

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O0

void BYTE_OUT1IR(dill_stream s,int rex,int insn1,int imm32)

{
  dill_stream_conflict s_00;
  undefined4 in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  int tmp_1;
  int tmp;
  uchar *tmp_ip;
  
  if (*(ulong *)(*(long *)(in_RDI + 8) + 0x10) <= *(ulong *)(*(long *)(in_RDI + 8) + 8)) {
    extend_dill_stream((dill_stream_conflict)CONCAT44(in_ESI,in_EDX));
  }
  s_00 = *(dill_stream_conflict *)(*(long *)(in_RDI + 8) + 8);
  if (in_ESI == 0) {
    *(char *)&s_00->j = (char)in_EDX;
    *(undefined4 *)((long)&s_00->j + 1) = in_ECX;
  }
  else {
    *(byte *)&s_00->j = (byte)in_ESI | 0x40;
    *(char *)((long)&s_00->j + 1) = (char)in_EDX;
    *(undefined4 *)((long)&s_00->j + 2) = in_ECX;
  }
  if (*(int *)(in_RDI + 0x18) != 0) {
    dump_cur_dill_insn(s_00);
  }
  *(long *)(*(long *)(in_RDI + 8) + 8) = *(long *)(*(long *)(in_RDI + 8) + 8) + 5;
  if (in_ESI != 0) {
    *(long *)(*(long *)(in_RDI + 8) + 8) = *(long *)(*(long *)(in_RDI + 8) + 8) + 1;
  }
  return;
}

Assistant:

static void
BYTE_OUT1IR(dill_stream s, int rex, int insn1, int imm32)
{
    unsigned char* tmp_ip;
    if (s->p->cur_ip >= s->p->code_limit) {
        extend_dill_stream(s);
    }
    tmp_ip = (unsigned char*)s->p->cur_ip;
    if (rex != 0) {
        int tmp = imm32;
        *tmp_ip = (unsigned char)rex | 0x40;
        *(tmp_ip + 1) = (unsigned char)insn1;
        memcpy(tmp_ip + 2, &tmp, 4);
    } else {
        int tmp = imm32;
        *(tmp_ip) = (unsigned char)insn1;
        memcpy(tmp_ip + 1, &tmp, 4);
    }
    if (s->dill_debug)
        dump_cur_dill_insn(s);
    s->p->cur_ip = ((char*)s->p->cur_ip) + 5;
    if (rex != 0)
        s->p->cur_ip++;
}